

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

bool __thiscall
ON_OBSOLETE_V5_Leader::GetTextDirection(ON_OBSOLETE_V5_Leader *this,ON_2dVector *text_dir)

{
  ON_2dPoint *pOVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ON_2dVector OVar8;
  
  lVar5 = (long)(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
                m_count;
  if (lVar5 < 2) {
    ON_2dVector::Set(text_dir,-1.0,0.0);
    bVar3 = false;
  }
  else {
    lVar4 = lVar5 * 0x10 + -0x20;
    lVar6 = lVar5;
    do {
      pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a
      ;
      OVar8 = ON_2dPoint::operator-(pOVar1 + lVar5 + -1,(ON_2dPoint *)((long)&pOVar1->x + lVar4));
      *text_dir = OVar8;
      bVar3 = ON_2dVector::Unitize(text_dir);
      if (bVar3) {
        return true;
      }
      ON_2dVector::Set(text_dir,-1.0,0.0);
      lVar7 = lVar6 + -1;
      lVar4 = lVar4 + -0x10;
      lVar2 = lVar6 + -3;
      bVar3 = 1 < lVar7;
      lVar6 = lVar7;
    } while (SBORROW8(lVar7,2) == lVar2 < 0);
  }
  return bVar3;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::GetTextDirection( ON_2dVector& text_dir ) const 
{
  bool rc = false;
  const int point_count = m_points.Count();
  if ( point_count < 2 )
  {
    text_dir.Set(-1.0,0.0);
  }
  else
  {
    int i; // 20 June 2011 Fixed textdir for leaders with 2 points. rr86801
    for(i = point_count-1; i >= 1; i--)
    {
      text_dir = m_points[point_count-1] -  m_points[i-1];
      if(text_dir.Unitize())
      {
        rc = true;
        break;
      }
      text_dir.Set(-1.0,0.0);
    }
  }
  return rc;
}